

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O3

void test_ecdsa_edge_cases(void)

{
  char *pcVar1;
  char *pcVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int iVar26;
  long lVar27;
  long lVar28;
  uchar *noncedata;
  uchar *p1;
  secp256k1_context *psVar29;
  secp256k1_context *psVar30;
  secp256k1_context *psVar31;
  secp256k1_context *psVar32;
  secp256k1_context *psVar33;
  secp256k1_context *psVar34;
  secp256k1_context *psVar35;
  secp256k1_context *psVar36;
  long lVar37;
  code *in_R8;
  long lVar38;
  undefined8 uVar39;
  bool bVar40;
  secp256k1_scalar sr;
  size_t siglen;
  secp256k1_scalar ss;
  secp256k1_scalar msg;
  secp256k1_scalar ss_2;
  secp256k1_ecdsa_signature sig;
  uchar msg_3 [32];
  secp256k1_gej keyj;
  undefined1 local_4178 [8];
  undefined8 uStack_4170;
  undefined1 auStack_4168 [12];
  undefined4 uStack_415c;
  size_t local_4150;
  undefined1 local_4148 [4];
  undefined1 auStack_4144 [12];
  undefined1 auStack_4138 [15];
  undefined1 uStack_4129;
  undefined1 local_4128 [4];
  undefined1 auStack_4124 [12];
  uint64_t local_4118;
  uint64_t uStack_4110;
  uint64_t local_4108;
  uint64_t uStack_4100;
  uint64_t local_40f8;
  uint64_t uStack_40f0;
  secp256k1_scalar local_40e8;
  uint local_40bc;
  undefined1 local_40b8 [128];
  undefined1 local_4038 [40];
  _func_void_char_ptr_void_ptr *p_Stack_4010;
  undefined4 local_4008;
  undefined4 uStack_4004;
  undefined4 uStack_4000;
  undefined4 uStack_3ffc;
  uint64_t auStack_2038 [1025];
  
  psVar29 = (secp256k1_context *)local_4178;
  psVar30 = (secp256k1_context *)local_4178;
  psVar31 = (secp256k1_context *)local_4178;
  psVar32 = (secp256k1_context *)local_4178;
  psVar33 = (secp256k1_context *)local_4178;
  psVar34 = (secp256k1_context *)local_4178;
  psVar35 = (secp256k1_context *)local_4178;
  psVar36 = (secp256k1_context *)local_4178;
  _local_4148 = ZEXT816(1);
  _auStack_4138 = ZEXT816(0);
  secp256k1_scalar_negate((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
  secp256k1_scalar_inverse((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
  _local_4178 = (secp256k1_callback)ZEXT816(1);
  _auStack_4168 = ZEXT816(0);
  secp256k1_ecmult_gen
            (&CTX->ecmult_gen_ctx,(secp256k1_gej *)local_4038,(secp256k1_scalar *)local_4178);
  secp256k1_ge_set_gej((secp256k1_ge *)local_40b8,(secp256k1_gej *)local_4038);
  local_4118 = auStack_4138._0_8_;
  uStack_4110 = stack0xffffffffffffbed0;
  _local_4128 = _local_4148;
  iVar26 = secp256k1_ecdsa_sig_verify
                     ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                      (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4128);
  if (iVar26 == 0) {
    _local_4178 = (secp256k1_callback)ZEXT816(1);
    _auStack_4168 = ZEXT816(0);
    local_40b8._0_8_ = (void *)0x0;
    local_40b8._8_8_ = 0;
    local_40b8._16_8_ = 0;
    local_40b8._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    _local_4128 = ZEXT816(0);
    local_4118 = 0;
    uStack_4110 = 0;
    psVar29 = (secp256k1_context *)local_4038;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar29,&DAT_00199530,0x21);
    if (iVar26 == 0) goto LAB_001746dd;
    psVar29 = (secp256k1_context *)local_4128;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar29,(secp256k1_scalar *)local_4178,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40b8);
    if (iVar26 != 0) goto LAB_001746e2;
    local_40b8._8_8_ = 0;
    local_40b8._16_8_ = 0;
    local_40b8._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    local_40b8._0_8_ = (void *)0x2;
    local_40b8[0x20] = '\x01';
    _auStack_4138 = ZEXT816(0);
    _local_4148 = ZEXT816(0);
    _local_4128 = ZEXT816(0);
    local_4118 = 0;
    uStack_4110 = 0;
    _local_4178 = (secp256k1_callback)ZEXT816(1);
    _auStack_4168 = ZEXT816(0);
    psVar29 = (secp256k1_context *)local_4038;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar29,local_40b8,0x21);
    if (iVar26 == 0) goto LAB_001746e7;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
    if (iVar26 != 0) goto LAB_001746ec;
    local_4118 = 0;
    uStack_4110 = 0;
    stack0xffffffffffffbed9 = ZEXT715(0);
    local_4128[0] = 2;
    local_4108 = CONCAT71(local_4108._1_7_,2);
    local_40e8.d[0] = 2;
    local_40e8.d[1] = 0;
    local_40e8.d[2] = 0;
    local_40e8.d[3] = 0;
    _local_4178 = (secp256k1_callback)ZEXT816(0);
    _auStack_4168 = ZEXT816(0);
    _local_4148 = ZEXT816(2);
    _auStack_4138 = ZEXT816(0);
    psVar30 = (secp256k1_context *)local_4038;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar30,local_4128,0x21);
    if (iVar26 == 0) goto LAB_001746f1;
    psVar30 = (secp256k1_context *)local_40b8;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar30,&DAT_00199560,0x21);
    if (iVar26 == 0) goto LAB_001746f6;
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_4038,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 == 0) goto LAB_001746fb;
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_40b8,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 == 0) goto LAB_00174700;
    secp256k1_scalar_negate(&local_40e8,&local_40e8);
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_4038,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 == 0) goto LAB_00174705;
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_40b8,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 == 0) goto LAB_0017470a;
    local_40e8.d[0] = 1;
    local_40e8.d[1] = 0;
    local_40e8.d[2] = 0;
    local_40e8.d[3] = 0;
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_4038,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 != 0) goto LAB_0017470f;
    psVar30 = (secp256k1_context *)local_4148;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar30,&local_40e8,(secp256k1_ge *)local_40b8,
                        (secp256k1_scalar *)local_4178);
    if (iVar26 != 0) goto LAB_00174714;
    _local_4148 = ZEXT816(1);
    _auStack_4138 = ZEXT816(0);
    _local_4128 = ZEXT816(1);
    local_4118 = 0;
    uStack_4110 = 0;
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_4178,"",(int *)0x0);
    psVar30 = (secp256k1_context *)local_4038;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar30,&DAT_00199590,0x21);
    if (iVar26 == 0) goto LAB_00174719;
    psVar30 = (secp256k1_context *)local_40b8;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar30,&DAT_001995c0,0x21);
    if (iVar26 == 0) goto LAB_0017471e;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
    if (iVar26 == 0) goto LAB_00174723;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4128);
    if (iVar26 == 0) goto LAB_00174728;
    secp256k1_scalar_negate((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
    if (iVar26 == 0) goto LAB_0017472d;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4128);
    if (iVar26 == 0) goto LAB_00174732;
    _local_4148 = ZEXT816(2);
    _auStack_4138 = ZEXT816(0);
    secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4148,(secp256k1_scalar *)local_4148);
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_4128);
    if (iVar26 != 0) goto LAB_00174737;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4148,
                        (secp256k1_ge *)local_40b8,(secp256k1_scalar *)local_4128);
    if (iVar26 != 0) goto LAB_0017473c;
    _local_4178 = (secp256k1_callback)ZEXT816(1);
    _auStack_4168 = ZEXT816(0);
    local_40b8._0_8_ = (void *)0x1;
    local_40b8._8_8_ = 0;
    local_40b8._16_8_ = 0;
    local_40b8._24_8_ = (_func_void_char_ptr_void_ptr *)0x0;
    secp256k1_scalar_negate((secp256k1_scalar *)local_40b8,(secp256k1_scalar *)local_40b8);
    secp256k1_scalar_set_b32((secp256k1_scalar *)local_4128,"",(int *)0x0);
    psVar36 = (secp256k1_context *)local_4038;
    iVar26 = secp256k1_eckey_pubkey_parse((secp256k1_ge *)psVar36,&DAT_001995f0,0x21);
    if (iVar26 == 0) goto LAB_00174741;
    psVar36 = (secp256k1_context *)local_4128;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar36,(secp256k1_scalar *)local_4178,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40b8);
    if (iVar26 == 0) goto LAB_00174746;
    secp256k1_scalar_negate((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
    psVar36 = (secp256k1_context *)local_4128;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)psVar36,(secp256k1_scalar *)local_4178,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40b8);
    if (iVar26 == 0) goto LAB_0017474b;
    _local_4178 = (secp256k1_callback)ZEXT816(3);
    _auStack_4168 = ZEXT816(0);
    secp256k1_scalar_inverse_var((secp256k1_scalar *)local_4178,(secp256k1_scalar *)local_4178);
    psVar36 = (secp256k1_context *)local_4128;
    iVar26 = secp256k1_ecdsa_sig_verify
                       ((secp256k1_scalar *)local_4128,(secp256k1_scalar *)local_4178,
                        (secp256k1_ge *)local_4038,(secp256k1_scalar *)local_40b8);
    if (iVar26 != 0) goto LAB_00174750;
    local_40e8.d[2]._0_1_ = '\0';
    local_40e8.d[2]._1_1_ = '\0';
    local_40e8.d[2]._2_1_ = '\0';
    local_40e8.d[2]._3_1_ = '\0';
    local_40e8.d[2]._4_1_ = '\0';
    local_40e8.d[2]._5_1_ = '\0';
    local_40e8.d[2]._6_1_ = '\0';
    local_40e8.d[2]._7_1_ = '\0';
    local_40e8.d[3]._0_1_ = '\0';
    local_40e8.d[3]._1_1_ = '\0';
    local_40e8.d[3]._2_1_ = '\0';
    local_40e8.d[3]._3_1_ = '\0';
    local_40e8.d[3]._4_1_ = '\0';
    local_40e8.d[3]._5_1_ = '\0';
    local_40e8.d[3]._6_1_ = '\0';
    local_40e8.d[3]._7_1_ = '\x01';
    local_40e8.d[0]._0_1_ = '\0';
    local_40e8.d[0]._1_1_ = '\0';
    local_40e8.d[0]._2_1_ = '\0';
    local_40e8.d[0]._3_1_ = '\0';
    local_40e8.d[0]._4_1_ = '\0';
    local_40e8.d[0]._5_1_ = '\0';
    local_40e8.d[0]._6_1_ = '\0';
    local_40e8.d[0]._7_1_ = '\0';
    local_40e8.d[1]._0_1_ = '\0';
    local_40e8.d[1]._1_1_ = '\0';
    local_40e8.d[1]._2_1_ = '\0';
    local_40e8.d[1]._3_1_ = '\0';
    local_40e8.d[1]._4_1_ = '\0';
    local_40e8.d[1]._5_1_ = '\0';
    local_40e8.d[1]._6_1_ = '\0';
    local_40e8.d[1]._7_1_ = '\0';
    local_40b8._112_8_ = 0x62777a810be012b8;
    local_40b8._120_8_ = 0xa9293eb931dddf65;
    local_40b8._96_8_ = 0x5344230681994186;
    local_40b8._104_8_ = 0xf7f478316a9d5faa;
    in_R8 = precomputed_nonce_function;
    psVar36 = CTX;
    iVar26 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (uchar *)&local_40e8,precomputed_nonce_function,"");
    if (iVar26 != 0) goto LAB_00174755;
    in_R8 = precomputed_nonce_function;
    psVar36 = CTX;
    iVar26 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (uchar *)&local_40e8,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    if (iVar26 != 0) goto LAB_0017475a;
    local_40b8[0x7f] = 0xaa;
    in_R8 = precomputed_nonce_function;
    psVar36 = CTX;
    iVar26 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (uchar *)&local_40e8,precomputed_nonce_function,"");
    psVar29 = CTX;
    if (iVar26 != 1) goto LAB_0017475f;
    auVar6._12_4_ = 0;
    auVar6._0_12_ = auStack_4124;
    _local_4128 = auVar6 << 0x20;
    local_4038._0_8_ = (CTX->illegal_callback).fn;
    local_4038._8_8_ = (CTX->illegal_callback).data;
    psVar36 = CTX;
    if (CTX == &secp256k1_context_static_) goto LAB_00174764;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar29->illegal_callback).data = (secp256k1_context *)local_4128;
    in_R8 = precomputed_nonce_function;
    iVar26 = secp256k1_ecdsa_sign
                       (psVar29,(secp256k1_ecdsa_signature *)0x0,local_40b8 + 0x60,
                        (uchar *)&local_40e8,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    psVar30 = CTX;
    if (iVar26 != 0) goto LAB_00174769;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4128 != (undefined1  [4])0x1) goto LAB_0017476e;
    auVar7._12_4_ = 0;
    auVar7._0_12_ = auStack_4124;
    _local_4128 = auVar7 << 0x20;
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_00174773;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_context *)local_4128;
    in_R8 = precomputed_nonce_function;
    iVar26 = secp256k1_ecdsa_sign
                       (psVar30,(secp256k1_ecdsa_signature *)local_40b8,(uchar *)0x0,
                        (uchar *)&local_40e8,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    psVar36 = CTX;
    if (iVar26 != 0) goto LAB_00174778;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar36->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4128 != (undefined1  [4])0x1) goto LAB_0017477d;
    auVar8._12_4_ = 0;
    auVar8._0_12_ = auStack_4124;
    _local_4128 = auVar8 << 0x20;
    local_4038._0_8_ = (psVar36->illegal_callback).fn;
    local_4038._8_8_ = (psVar36->illegal_callback).data;
    if (psVar36 == &secp256k1_context_static_) goto LAB_00174782;
    (psVar36->illegal_callback).fn = counting_callback_fn;
    (psVar36->illegal_callback).data = (secp256k1_context *)local_4128;
    in_R8 = precomputed_nonce_function;
    iVar26 = secp256k1_ecdsa_sign
                       (psVar36,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (uchar *)0x0,precomputed_nonce_function,test_ecdsa_edge_cases::nonce2);
    psVar29 = CTX;
    if (iVar26 != 0) goto LAB_00174787;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar29->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4128 != (undefined1  [4])0x1) goto LAB_0017478c;
    in_R8 = precomputed_nonce_function;
    iVar26 = secp256k1_ecdsa_sign
                       (psVar29,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (uchar *)&local_40e8,precomputed_nonce_function,
                        test_ecdsa_edge_cases::nonce2);
    if (iVar26 != 1) goto LAB_00174791;
    psVar29 = CTX;
    iVar26 = secp256k1_ec_pubkey_create(CTX,(secp256k1_pubkey *)local_4128,(uchar *)&local_40e8);
    psVar30 = CTX;
    if (iVar26 == 0) goto LAB_00174796;
    auVar9._12_4_ = 0;
    auVar9._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar9 << 0x20);
    local_4038._0_8_ = (CTX->illegal_callback).fn;
    local_4038._8_8_ = (CTX->illegal_callback).data;
    if (CTX == &secp256k1_context_static_) goto LAB_0017479b;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747a0;
    auVar10._12_4_ = 0;
    auVar10._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar10 << 0x20);
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_001747a5;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747aa;
    auVar11._12_4_ = 0;
    auVar11._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar11 << 0x20);
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_001747af;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar29 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar29->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747b4;
    iVar26 = secp256k1_ecdsa_verify
                       (psVar29,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (secp256k1_pubkey *)local_4128);
    psVar30 = CTX;
    if (iVar26 == 0) goto LAB_001747b9;
    auVar12._12_4_ = 0;
    auVar12._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar12 << 0x20);
    local_4038._0_8_ = (CTX->illegal_callback).fn;
    local_4038._8_8_ = (CTX->illegal_callback).data;
    if (CTX == &secp256k1_context_static_) goto LAB_001747be;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    local_40f8 = 0;
    uStack_40f0 = 0;
    local_4108 = 0;
    uStack_4100 = 0;
    local_4118 = 0;
    uStack_4110 = 0;
    _local_4128 = ZEXT816(0);
    counting_callback_fn((char *)psVar29,local_4178);
    psVar29 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar29->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747c3;
    auVar13._12_4_ = 0;
    auVar13._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar13 << 0x20);
    local_4038._0_8_ = (psVar29->illegal_callback).fn;
    local_4038._8_8_ = (psVar29->illegal_callback).data;
    if (psVar29 == &secp256k1_context_static_) goto LAB_001747c8;
    (psVar29->illegal_callback).fn = counting_callback_fn;
    (psVar29->illegal_callback).data = local_4178;
    iVar26 = secp256k1_ecdsa_verify
                       (psVar29,(secp256k1_ecdsa_signature *)local_40b8,local_40b8 + 0x60,
                        (secp256k1_pubkey *)local_4128);
    psVar30 = CTX;
    if (iVar26 != 0) goto LAB_001747cd;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747d2;
    local_4150 = 0x48;
    auVar14._12_4_ = 0;
    auVar14._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar14 << 0x20);
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_001747d7;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747dc;
    auVar15._12_4_ = 0;
    auVar15._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar15 << 0x20);
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_001747e1;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar30->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747e6;
    auVar16._12_4_ = 0;
    auVar16._0_12_ = stack0xffffffffffffbe8c;
    _local_4178 = (secp256k1_callback)(auVar16 << 0x20);
    local_4038._0_8_ = (psVar30->illegal_callback).fn;
    local_4038._8_8_ = (psVar30->illegal_callback).data;
    if (psVar30 == &secp256k1_context_static_) goto LAB_001747eb;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = local_4178;
    counting_callback_fn((char *)psVar29,local_4178);
    psVar29 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4038._0_8_;
    (psVar29->illegal_callback).data = (void *)local_4038._8_8_;
    if (local_4178._0_4_ != 1) goto LAB_001747f0;
    iVar26 = secp256k1_ecdsa_signature_serialize_der
                       (psVar29,local_4038,&local_4150,(secp256k1_ecdsa_signature *)local_40b8);
    psVar30 = CTX;
    if (iVar26 == 0) goto LAB_001747f5;
    auVar17._12_4_ = 0;
    auVar17._0_12_ = auStack_4144;
    _local_4148 = auVar17 << 0x20;
    _local_4178 = CTX->illegal_callback;
    if (CTX == &secp256k1_context_static_) goto LAB_001747fa;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar30->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_001747ff;
    auVar18._12_4_ = 0;
    auVar18._0_12_ = auStack_4144;
    _local_4148 = auVar18 << 0x20;
    _local_4178 = psVar30->illegal_callback;
    if (psVar30 == &secp256k1_context_static_) goto LAB_00174804;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar29 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar29->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_00174809;
    iVar26 = secp256k1_ecdsa_signature_parse_der
                       (psVar29,(secp256k1_ecdsa_signature *)local_40b8,local_4038,local_4150);
    if (iVar26 == 0) goto LAB_0017480e;
    local_4150 = 10;
    psVar29 = CTX;
    iVar26 = secp256k1_ecdsa_signature_serialize_der
                       (CTX,local_4038,&local_4150,(secp256k1_ecdsa_signature *)local_40b8);
    psVar30 = CTX;
    if (iVar26 != 0) goto LAB_00174813;
    auVar19._12_4_ = 0;
    auVar19._0_12_ = auStack_4144;
    _local_4148 = auVar19 << 0x20;
    _local_4178 = CTX->illegal_callback;
    if (CTX == &secp256k1_context_static_) goto LAB_00174818;
    (CTX->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar30->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_0017481d;
    auVar20._12_4_ = 0;
    auVar20._0_12_ = auStack_4144;
    _local_4148 = auVar20 << 0x20;
    _local_4178 = psVar30->illegal_callback;
    if (psVar30 == &secp256k1_context_static_) goto LAB_00174822;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar30->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_00174827;
    auVar21._12_4_ = 0;
    auVar21._0_12_ = auStack_4144;
    _local_4148 = auVar21 << 0x20;
    _local_4178 = psVar30->illegal_callback;
    if (psVar30 == &secp256k1_context_static_) goto LAB_0017482c;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar30->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_00174831;
    stack0xffffffffffffbeb9 = local_40b8._33_7_;
    local_4148[0] = local_40b8[0x20];
    local_4178 = (undefined1  [8])local_40b8._0_8_;
    uStack_4170 = (void *)local_40b8._8_8_;
    stack0xffffffffffffbea0 = local_40b8._24_8_;
    auStack_4168._0_8_ = local_40b8._16_8_;
    auStack_4144._4_8_ = local_40b8._40_8_;
    stack0xffffffffffffbed0 = local_40b8._56_8_;
    auStack_4138._0_8_ = local_40b8._48_8_;
    secp256k1_scalar_get_b32(local_4038,(secp256k1_scalar *)local_4178);
    psVar29 = (secp256k1_context *)(local_4038 + 0x20);
    secp256k1_scalar_get_b32((uchar *)psVar29,(secp256k1_scalar *)local_4148);
    auVar22._12_4_ = 0;
    auVar22._0_12_ = auStack_4144;
    _local_4148 = auVar22 << 0x20;
    _local_4178 = psVar30->illegal_callback;
    if (psVar30 == &secp256k1_context_static_) goto LAB_00174836;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar30 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar30->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_0017483b;
    auVar23._12_4_ = 0;
    auVar23._0_12_ = auStack_4144;
    _local_4148 = auVar23 << 0x20;
    _local_4178 = psVar30->illegal_callback;
    if (psVar30 == &secp256k1_context_static_) goto LAB_00174840;
    (psVar30->illegal_callback).fn = counting_callback_fn;
    (psVar30->illegal_callback).data = (secp256k1_scalar *)local_4148;
    counting_callback_fn((char *)psVar29,(secp256k1_scalar *)local_4148);
    psVar29 = CTX;
    (CTX->illegal_callback).fn = (_func_void_char_ptr_void_ptr *)local_4178;
    (psVar29->illegal_callback).data = uStack_4170;
    if (local_4148 != (undefined1  [4])0x1) goto LAB_00174845;
    iVar26 = secp256k1_ecdsa_signature_parse_compact
                       (psVar29,(secp256k1_ecdsa_signature *)local_40b8,local_4038);
    if (iVar26 == 0) goto LAB_0017484a;
    local_4008 = 0xffffffff;
    uStack_4004 = 0xffffffff;
    uStack_4000 = 0xffffffff;
    uStack_3ffc = 0xffffffff;
    local_4038._32_8_ = 0xffffffffffffffff;
    p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
    local_4038._16_8_ = 0xffffffffffffffff;
    local_4038._24_8_ = 0xffffffffffffffff;
    local_4038._0_8_ = (_func_void_char_ptr_void_ptr *)0xffffffffffffffff;
    local_4038._8_8_ = (uchar *)0xffffffffffffffff;
    psVar29 = CTX;
    iVar26 = secp256k1_ecdsa_signature_parse_compact
                       (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_4038);
    if (iVar26 == 0) {
      uVar39 = CONCAT71((int7)((ulong)local_4178 >> 8),1);
LAB_00173e95:
      noncedata = "";
      if ((char)uVar39 != '\0') {
        noncedata = (uchar *)0x0;
      }
      _local_4148 = (undefined1  [16])0x0;
      auStack_4138 = SUB1615((undefined1  [16])0x0,0);
      uStack_4129 = 1;
      uStack_4170._0_4_ = 0xffffffff;
      local_4178 = (undefined1  [8])0xffffffffffffffff;
      uStack_4170._4_4_ = 0xffffffff;
      auStack_4168._8_4_ = 0xffffffff;
      auStack_4168._0_8_ = 0xffffffffffffffff;
      uStack_415c = 0xffffffff;
      in_R8 = (code *)0x0;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_4148,local_4178,
                          (secp256k1_nonce_function)0x0,noncedata);
      if (iVar26 != 0) goto LAB_00174697;
      lVar27 = 0;
      do {
        pcVar1 = local_40b8 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 != '\0') goto LAB_0017469c;
      _auStack_4168 = (undefined1  [16])0x0;
      local_4178 = (undefined1  [8])0x0;
      uStack_4170 = (void *)0x0;
      in_R8 = (code *)0x0;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_4148,local_4178,
                          (secp256k1_nonce_function)0x0,noncedata);
      if (iVar26 != 0) goto LAB_001746a1;
      lVar27 = 0;
      do {
        pcVar1 = local_40b8 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 != '\0') goto LAB_001746a6;
      uStack_415c._3_1_ = 1;
      in_R8 = nonce_function_test_fail;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_4148,local_4178,
                          nonce_function_test_fail,noncedata);
      if (iVar26 != 0) goto LAB_001746ab;
      lVar27 = 0;
      do {
        pcVar1 = local_40b8 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 != '\0') goto LAB_001746b0;
      in_R8 = nonce_function_test_retry;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_40b8,local_4148,local_4178,
                          nonce_function_test_retry,noncedata);
      if (iVar26 != 1) goto LAB_001746b5;
      lVar27 = 0;
      do {
        pcVar1 = local_40b8 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 == '\0') goto LAB_001746ba;
      in_R8 = nonce_function_rfc6979;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_4128,local_4148,local_4178,
                          nonce_function_rfc6979,noncedata);
      if (iVar26 != 1) goto LAB_001746bf;
      lVar27 = 0;
      do {
        pcVar1 = local_4128 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 == '\0') goto LAB_001746c4;
      lVar27 = 0;
      do {
        if (local_40b8[lVar27] != local_4128[lVar27]) goto LAB_00174854;
        lVar27 = lVar27 + 1;
      } while (lVar27 != 0x40);
      in_R8 = (code *)0x0;
      psVar29 = CTX;
      iVar26 = secp256k1_ecdsa_sign
                         (CTX,(secp256k1_ecdsa_signature *)local_4128,local_4148,local_4178,
                          (secp256k1_nonce_function)0x0,noncedata);
      if (iVar26 != 1) goto LAB_001746c9;
      lVar27 = 0;
      do {
        pcVar1 = local_4128 + lVar27;
        if (*pcVar1 != '\0') break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar1 == '\0') goto LAB_001746ce;
      lVar27 = 0;
      do {
        pcVar2 = local_40b8 + lVar27;
        pcVar1 = local_4128 + lVar27;
        if (*pcVar2 != *pcVar1) break;
        bVar40 = lVar27 != 0x3f;
        lVar27 = lVar27 + 1;
      } while (bVar40);
      if (*pcVar2 == *pcVar1) goto code_r0x001740ba;
      goto LAB_001746d3;
    }
  }
  else {
LAB_001746d8:
    test_ecdsa_edge_cases_cold_1();
LAB_001746dd:
    test_ecdsa_edge_cases_cold_104();
LAB_001746e2:
    test_ecdsa_edge_cases_cold_2();
LAB_001746e7:
    psVar30 = psVar29;
    test_ecdsa_edge_cases_cold_103();
LAB_001746ec:
    test_ecdsa_edge_cases_cold_3();
LAB_001746f1:
    test_ecdsa_edge_cases_cold_102();
LAB_001746f6:
    test_ecdsa_edge_cases_cold_101();
LAB_001746fb:
    test_ecdsa_edge_cases_cold_100();
LAB_00174700:
    test_ecdsa_edge_cases_cold_99();
LAB_00174705:
    test_ecdsa_edge_cases_cold_98();
LAB_0017470a:
    test_ecdsa_edge_cases_cold_97();
LAB_0017470f:
    test_ecdsa_edge_cases_cold_4();
LAB_00174714:
    test_ecdsa_edge_cases_cold_5();
LAB_00174719:
    test_ecdsa_edge_cases_cold_96();
LAB_0017471e:
    test_ecdsa_edge_cases_cold_95();
    psVar31 = psVar30;
LAB_00174723:
    psVar32 = psVar31;
    test_ecdsa_edge_cases_cold_94();
LAB_00174728:
    test_ecdsa_edge_cases_cold_93();
    psVar33 = psVar32;
LAB_0017472d:
    psVar34 = psVar33;
    test_ecdsa_edge_cases_cold_92();
LAB_00174732:
    test_ecdsa_edge_cases_cold_91();
    psVar35 = psVar34;
LAB_00174737:
    psVar36 = psVar35;
    test_ecdsa_edge_cases_cold_6();
LAB_0017473c:
    test_ecdsa_edge_cases_cold_7();
LAB_00174741:
    test_ecdsa_edge_cases_cold_90();
LAB_00174746:
    test_ecdsa_edge_cases_cold_89();
LAB_0017474b:
    test_ecdsa_edge_cases_cold_88();
LAB_00174750:
    test_ecdsa_edge_cases_cold_8();
LAB_00174755:
    test_ecdsa_edge_cases_cold_9();
LAB_0017475a:
    test_ecdsa_edge_cases_cold_10();
LAB_0017475f:
    test_ecdsa_edge_cases_cold_11();
LAB_00174764:
    test_ecdsa_edge_cases_cold_87();
    psVar29 = psVar36;
LAB_00174769:
    psVar30 = psVar29;
    test_ecdsa_edge_cases_cold_12();
LAB_0017476e:
    test_ecdsa_edge_cases_cold_13();
LAB_00174773:
    test_ecdsa_edge_cases_cold_86();
LAB_00174778:
    psVar36 = psVar30;
    test_ecdsa_edge_cases_cold_14();
LAB_0017477d:
    test_ecdsa_edge_cases_cold_15();
LAB_00174782:
    test_ecdsa_edge_cases_cold_85();
LAB_00174787:
    psVar29 = psVar36;
    test_ecdsa_edge_cases_cold_16();
LAB_0017478c:
    test_ecdsa_edge_cases_cold_17();
LAB_00174791:
    test_ecdsa_edge_cases_cold_18();
LAB_00174796:
    test_ecdsa_edge_cases_cold_84();
LAB_0017479b:
    test_ecdsa_edge_cases_cold_83();
LAB_001747a0:
    test_ecdsa_edge_cases_cold_19();
LAB_001747a5:
    test_ecdsa_edge_cases_cold_82();
LAB_001747aa:
    test_ecdsa_edge_cases_cold_20();
LAB_001747af:
    test_ecdsa_edge_cases_cold_81();
LAB_001747b4:
    test_ecdsa_edge_cases_cold_21();
LAB_001747b9:
    test_ecdsa_edge_cases_cold_80();
LAB_001747be:
    test_ecdsa_edge_cases_cold_79();
LAB_001747c3:
    test_ecdsa_edge_cases_cold_22();
LAB_001747c8:
    test_ecdsa_edge_cases_cold_78();
LAB_001747cd:
    test_ecdsa_edge_cases_cold_23();
LAB_001747d2:
    test_ecdsa_edge_cases_cold_24();
LAB_001747d7:
    test_ecdsa_edge_cases_cold_77();
LAB_001747dc:
    test_ecdsa_edge_cases_cold_25();
LAB_001747e1:
    test_ecdsa_edge_cases_cold_76();
LAB_001747e6:
    test_ecdsa_edge_cases_cold_26();
LAB_001747eb:
    test_ecdsa_edge_cases_cold_75();
LAB_001747f0:
    test_ecdsa_edge_cases_cold_27();
LAB_001747f5:
    test_ecdsa_edge_cases_cold_74();
LAB_001747fa:
    test_ecdsa_edge_cases_cold_73();
LAB_001747ff:
    test_ecdsa_edge_cases_cold_28();
LAB_00174804:
    test_ecdsa_edge_cases_cold_72();
LAB_00174809:
    test_ecdsa_edge_cases_cold_29();
LAB_0017480e:
    test_ecdsa_edge_cases_cold_71();
LAB_00174813:
    test_ecdsa_edge_cases_cold_30();
LAB_00174818:
    test_ecdsa_edge_cases_cold_70();
LAB_0017481d:
    test_ecdsa_edge_cases_cold_31();
LAB_00174822:
    test_ecdsa_edge_cases_cold_69();
LAB_00174827:
    test_ecdsa_edge_cases_cold_32();
LAB_0017482c:
    test_ecdsa_edge_cases_cold_68();
LAB_00174831:
    test_ecdsa_edge_cases_cold_33();
LAB_00174836:
    test_ecdsa_edge_cases_cold_67();
LAB_0017483b:
    test_ecdsa_edge_cases_cold_34();
LAB_00174840:
    test_ecdsa_edge_cases_cold_66();
LAB_00174845:
    test_ecdsa_edge_cases_cold_35();
LAB_0017484a:
    test_ecdsa_edge_cases_cold_65();
  }
  test_ecdsa_edge_cases_cold_36();
LAB_00174854:
  test_ecdsa_edge_cases_cold_45();
  goto LAB_00174859;
code_r0x001740ba:
  local_40bc = (uint)uVar39;
  lVar27 = 0;
  lVar38 = 0;
  do {
    local_4148[0] = (char)lVar38;
    in_R8 = (code *)0x0;
    psVar29 = CTX;
    iVar26 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_4128,local_4148,local_4178,
                        (secp256k1_nonce_function)0x0,noncedata);
    if (iVar26 != 1) {
      test_ecdsa_edge_cases_cold_48();
LAB_00174688:
      test_ecdsa_edge_cases_cold_61();
      goto LAB_0017468d;
    }
    lVar28 = 0;
    do {
      pcVar1 = local_4128 + lVar28;
      if (*pcVar1 != '\0') break;
      bVar40 = lVar28 != 0x3f;
      lVar28 = lVar28 + 1;
    } while (bVar40);
    if (*pcVar1 == '\0') goto LAB_00174688;
    lVar28 = lVar38 * 0x20;
    *(uint64_t *)(local_4038 + lVar28 + 0x10) = local_4118;
    *(uint64_t *)(local_4038 + lVar28 + 0x18) = uStack_4110;
    *(uint64_t *)(local_4038 + lVar28) = _local_4128;
    *(undefined8 *)(local_4038 + lVar28 + 8) = auStack_4124._4_8_;
    if (lVar38 != 0) {
      lVar37 = 0;
      do {
        if ((((*(long *)(local_4038 + lVar28) == *(long *)(local_4038 + lVar37)) &&
             (*(long *)(local_4038 + lVar28 + 8) == *(long *)(local_4038 + lVar37 + 8))) &&
            (*(long *)(local_4038 + lVar28 + 0x10) == *(long *)(local_4038 + lVar37 + 0x10))) &&
           (*(long *)(local_4038 + lVar28 + 0x18) == *(long *)(local_4038 + lVar37 + 0x18)))
        goto LAB_00174574;
        lVar37 = lVar37 + 0x20;
      } while (lVar27 != lVar37);
    }
    lVar38 = lVar38 + 1;
    lVar27 = lVar27 + 0x20;
  } while (lVar38 != 0x100);
  auVar24[0xf] = 0;
  auVar24._0_15_ = stack0xffffffffffffbeb9;
  _local_4148 = auVar24 << 8;
  uStack_4129 = 2;
  lVar38 = 0x100;
  lVar27 = 0x2000;
  do {
    local_4178[0] = (char)lVar38;
    in_R8 = (code *)0x0;
    psVar29 = CTX;
    iVar26 = secp256k1_ecdsa_sign
                       (CTX,(secp256k1_ecdsa_signature *)local_4128,local_4148,local_4178,
                        (secp256k1_nonce_function)0x0,noncedata);
    if (iVar26 != 1) goto LAB_0017468d;
    lVar28 = 0;
    do {
      pcVar1 = local_4128 + lVar28;
      if (*pcVar1 != '\0') break;
      bVar40 = lVar28 != 0x3f;
      lVar28 = lVar28 + 1;
    } while (bVar40);
    if (*pcVar1 == '\0') goto LAB_00174692;
    lVar28 = lVar38 * 0x20;
    *(uint64_t *)(local_4038 + lVar28) = _local_4128;
    *(undefined8 *)(local_4038 + lVar28 + 8) = auStack_4124._4_8_;
    *(uint64_t *)(local_4038 + lVar28 + 0x10) = local_4118;
    *(uint64_t *)(local_4038 + lVar28 + 0x18) = uStack_4110;
    lVar37 = 0;
    do {
      if (((*(long *)(local_4038 + lVar28) == *(long *)(local_4038 + lVar37)) &&
          (*(long *)(local_4038 + lVar28 + 8) == *(long *)(local_4038 + lVar37 + 8))) &&
         ((*(long *)(local_4038 + lVar28 + 0x10) == *(long *)(local_4038 + lVar37 + 0x10) &&
          (*(long *)(local_4038 + lVar28 + 0x18) == *(long *)(local_4038 + lVar37 + 0x18)))))
      goto LAB_0017456f;
      lVar37 = lVar37 + 0x20;
    } while (lVar27 != lVar37);
    lVar38 = lVar38 + 1;
    lVar27 = lVar27 + 0x20;
  } while (lVar38 != 0x200);
  uVar39 = 0;
  if ((local_40bc & 1) == 0) goto code_r0x001742b4;
  goto LAB_00173e95;
LAB_0017468d:
  test_ecdsa_edge_cases_cold_50();
LAB_00174692:
  test_ecdsa_edge_cases_cold_60();
LAB_00174697:
  test_ecdsa_edge_cases_cold_37();
LAB_0017469c:
  test_ecdsa_edge_cases_cold_38();
LAB_001746a1:
  test_ecdsa_edge_cases_cold_39();
LAB_001746a6:
  test_ecdsa_edge_cases_cold_40();
LAB_001746ab:
  test_ecdsa_edge_cases_cold_41();
LAB_001746b0:
  test_ecdsa_edge_cases_cold_42();
LAB_001746b5:
  test_ecdsa_edge_cases_cold_43();
LAB_001746ba:
  test_ecdsa_edge_cases_cold_64();
LAB_001746bf:
  test_ecdsa_edge_cases_cold_44();
LAB_001746c4:
  test_ecdsa_edge_cases_cold_63();
LAB_001746c9:
  test_ecdsa_edge_cases_cold_46();
LAB_001746ce:
  test_ecdsa_edge_cases_cold_62();
LAB_001746d3:
  test_ecdsa_edge_cases_cold_47();
  goto LAB_001746d8;
code_r0x001742b4:
  local_4118 = 0;
  uStack_4110 = 0;
  _local_4128 = (undefined1  [16])0x0;
  lVar27 = 0;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = auStack_4144._4_8_;
  _local_4148 = auVar25 << 0x40;
  local_40e8.d[0] = 0;
  local_40b8._96_8_ = 0;
  local_4038._0_8_ = 0x4d430001;
  local_4038._8_8_ = local_40b8 + 0x60;
  local_4038._16_8_ = 0x20;
  local_4038._24_8_ = 0;
  local_4038._32_8_ = 0;
  p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0x0;
  local_4150 = 0;
  nonce_function_rfc6979(local_4178,local_4128,local_4128,(uchar *)0x0,(void *)0x0,0);
  local_4038._0_8_ = 0x4d430005;
  local_4038._16_8_ = 0x20;
  local_4038._24_8_ = 0;
  local_4038._32_8_ = 0;
  p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0x0;
  local_4150 = 0;
  local_4038._8_8_ = local_4178;
  nonce_function_rfc6979(local_4148,local_4128,local_4128,local_4128,(void *)0x0,0);
  local_4038._0_8_ = 0x4d430005;
  local_4038._16_8_ = 0x20;
  local_4038._24_8_ = 0;
  local_4038._32_8_ = 0;
  p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0x0;
  local_4150 = 0;
  local_4038._8_8_ = local_4148;
  nonce_function_rfc6979((uchar *)&local_40e8,local_4128,local_4128,(uchar *)0x0,local_4128,0);
  local_4038._0_8_ = 0x4d430005;
  local_4038._16_8_ = 0x20;
  local_4038._24_8_ = 0;
  local_4038._32_8_ = 0;
  p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0x0;
  local_4150 = 0;
  local_4038._8_8_ = &local_40e8;
  nonce_function_rfc6979(local_40b8 + 0x60,local_4128,local_4128,local_4128,local_4128,0);
  local_4038._0_8_ = (_func_void_char_ptr_void_ptr *)0x4d430005;
  local_4038._8_8_ = local_40b8 + 0x60;
  local_4038._16_8_ = 0x20;
  local_4038._24_8_ = 0;
  local_4038._32_8_ = 0;
  p_Stack_4010 = (_func_void_char_ptr_void_ptr *)0x0;
  local_4150 = 0;
  do {
    if (local_4178[lVar27] != local_4148[lVar27]) goto LAB_00174579;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_59();
LAB_0017456f:
  test_ecdsa_edge_cases_cold_51();
LAB_00174574:
  test_ecdsa_edge_cases_cold_49();
LAB_00174579:
  lVar27 = 0;
  do {
    if (local_4178[lVar27] != *(char *)((long)local_40e8.d + lVar27)) goto LAB_00174595;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_58();
LAB_00174595:
  lVar27 = 0;
  do {
    if (local_4178[lVar27] != local_40b8[lVar27 + 0x60]) goto LAB_001745b1;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_57();
LAB_001745b1:
  lVar27 = 0;
  do {
    if (local_4148[lVar27] != *(char *)((long)local_40e8.d + lVar27)) goto LAB_001745ce;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_56();
LAB_001745ce:
  lVar27 = 0;
  do {
    if (local_4148[lVar27] != local_40b8[lVar27 + 0x60]) goto LAB_001745eb;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_55();
LAB_001745eb:
  lVar27 = 0;
  do {
    if (*(char *)((long)local_40e8.d + lVar27) != local_40b8[lVar27 + 0x60]) goto LAB_0017460b;
    lVar27 = lVar27 + 1;
  } while (lVar27 != 0x20);
  test_ecdsa_edge_cases_cold_54();
LAB_0017460b:
  local_4118._0_1_ = 0xba;
  local_4118._1_1_ = 0xae;
  local_4118._2_1_ = 0xdc;
  local_4118._3_1_ = 0xe6;
  local_4118._4_1_ = 0xaf;
  local_4118._5_1_ = 'H';
  local_4118._6_1_ = 0xa0;
  local_4118._7_1_ = ';';
  uStack_4110._0_1_ = 0xbf;
  uStack_4110._1_1_ = 0xd2;
  uStack_4110._2_1_ = '^';
  uStack_4110._3_1_ = 0x8c;
  uStack_4110._4_1_ = 0xd0;
  uStack_4110._5_1_ = '6';
  uStack_4110._6_1_ = 'A';
  uStack_4110._7_1_ = 'A';
  auStack_4124[4] = 0xff;
  auStack_4124[5] = 0xff;
  auStack_4124[6] = 0xff;
  auStack_4124[7] = 0xff;
  auStack_4124[8] = 0xff;
  auStack_4124[9] = 0xff;
  auStack_4124[10] = 0xff;
  auStack_4124[0xb] = 0xfe;
  local_4128[0] = 0xff;
  local_4128[1] = 0xff;
  local_4128[2] = 0xff;
  local_4128[3] = 0xff;
  auStack_4124[0] = 0xff;
  auStack_4124[1] = 0xff;
  auStack_4124[2] = 0xff;
  auStack_4124[3] = 0xff;
  in_R8 = (code *)0x0;
  psVar29 = CTX;
  iVar26 = ec_privkey_export_der(CTX,local_4038,(size_t *)local_4178,local_4128,0);
  if (iVar26 == 0) {
    in_R8 = (code *)0x1;
    psVar29 = CTX;
    iVar26 = ec_privkey_export_der(CTX,local_4038,(size_t *)local_4178,local_4128,1);
    if (iVar26 == 0) {
      return;
    }
    goto LAB_0017485e;
  }
LAB_00174859:
  test_ecdsa_edge_cases_cold_52();
LAB_0017485e:
  test_ecdsa_edge_cases_cold_53();
  uVar3 = *(uint64_t *)in_R8;
  uVar4 = *(uint64_t *)(in_R8 + 8);
  uVar5 = *(uint64_t *)(in_R8 + 0x18);
  (psVar29->ecmult_gen_ctx).scalar_offset.d[1] = *(uint64_t *)(in_R8 + 0x10);
  (psVar29->ecmult_gen_ctx).scalar_offset.d[2] = uVar5;
  *(uint64_t *)&psVar29->ecmult_gen_ctx = uVar3;
  (psVar29->ecmult_gen_ctx).scalar_offset.d[0] = uVar4;
  return;
}

Assistant:

static void test_ecdsa_edge_cases(void) {
    int t;
    secp256k1_ecdsa_signature sig;

    /* Test the case where ECDSA recomputes a point that is infinity. */
    {
        secp256k1_gej keyj;
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_negate(&ss, &ss);
        secp256k1_scalar_inverse(&ss, &ss);
        secp256k1_scalar_set_int(&sr, 1);
        secp256k1_ecmult_gen(&CTX->ecmult_gen_ctx, &keyj, &sr);
        secp256k1_ge_set_gej(&key, &keyj);
        msg = ss;
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with r of zero fails. */
    {
        const unsigned char pubkey_mods_zero[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x41
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 0);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey_mods_zero, 33));
        CHECK(secp256k1_ecdsa_sig_verify( &sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with s of zero fails. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x01
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 0);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 1);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Verify signature with message 0 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x02
        };
        const unsigned char pubkey2[33] = {
            0x02, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xfe, 0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0,
            0x3b, 0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41,
            0x43
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_set_int(&msg, 0);
        secp256k1_scalar_set_int(&sr, 2);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message 1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x02, 0x14, 0x4e, 0x5a, 0x58, 0xef, 0x5b, 0x22,
            0x6f, 0xd2, 0xe2, 0x07, 0x6a, 0x77, 0xcf, 0x05,
            0xb4, 0x1d, 0xe7, 0x4a, 0x30, 0x98, 0x27, 0x8c,
            0x93, 0xe6, 0xe6, 0x3c, 0x0b, 0xc4, 0x73, 0x76,
            0x25
        };
        const unsigned char pubkey2[33] = {
            0x02, 0x8a, 0xd5, 0x37, 0xed, 0x73, 0xd9, 0x40,
            0x1d, 0xa0, 0x33, 0xd2, 0xdc, 0xf0, 0xaf, 0xae,
            0x34, 0xcf, 0x5f, 0x96, 0x4c, 0x73, 0x28, 0x0f,
            0x92, 0xc0, 0xf6, 0x9d, 0xd9, 0xb2, 0x09, 0x10,
            0x62
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xeb
        };
        secp256k1_ge key;
        secp256k1_ge key2;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_eckey_pubkey_parse(&key2, pubkey2, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 2);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key2, &msg) == 0);
    }

    /* Verify signature with message -1 passes. */
    {
        const unsigned char pubkey[33] = {
            0x03, 0xaf, 0x97, 0xff, 0x7d, 0x3a, 0xf6, 0xa0,
            0x02, 0x94, 0xbd, 0x9f, 0x4b, 0x2e, 0xd7, 0x52,
            0x28, 0xdb, 0x49, 0x2a, 0x65, 0xcb, 0x1e, 0x27,
            0x57, 0x9c, 0xba, 0x74, 0x20, 0xd5, 0x1d, 0x20,
            0xf1
        };
        const unsigned char csr[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
            0x45, 0x51, 0x23, 0x19, 0x50, 0xb7, 0x5f, 0xc4,
            0x40, 0x2d, 0xa1, 0x72, 0x2f, 0xc9, 0xba, 0xee
        };
        secp256k1_ge key;
        secp256k1_scalar msg;
        secp256k1_scalar sr, ss;
        secp256k1_scalar_set_int(&ss, 1);
        secp256k1_scalar_set_int(&msg, 1);
        secp256k1_scalar_negate(&msg, &msg);
        secp256k1_scalar_set_b32(&sr, csr, NULL);
        CHECK(secp256k1_eckey_pubkey_parse(&key, pubkey, 33));
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_negate(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 1);
        secp256k1_scalar_set_int(&ss, 3);
        secp256k1_scalar_inverse_var(&ss, &ss);
        CHECK(secp256k1_ecdsa_sig_verify(&sr, &ss, &key, &msg) == 0);
    }

    /* Signature where s would be zero. */
    {
        secp256k1_pubkey pubkey;
        size_t siglen;
        unsigned char signature[72];
        static const unsigned char nonce[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        static const unsigned char nonce2[32] = {
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,
            0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFF,0xFE,
            0xBA,0xAE,0xDC,0xE6,0xAF,0x48,0xA0,0x3B,
            0xBF,0xD2,0x5E,0x8C,0xD0,0x36,0x41,0x40
        };
        const unsigned char key[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char msg[32] = {
            0x86, 0x41, 0x99, 0x81, 0x06, 0x23, 0x44, 0x53,
            0xaa, 0x5f, 0x9d, 0x6a, 0x31, 0x78, 0xf4, 0xf7,
            0xb8, 0x12, 0xe0, 0x0b, 0x81, 0x7a, 0x77, 0x62,
            0x65, 0xdf, 0xdd, 0x31, 0xb9, 0x3e, 0x29, 0xa9,
        };
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 0);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 0);
        msg[31] = 0xaa;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, NULL, msg, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, NULL, key, precomputed_nonce_function, nonce2));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_sign(CTX, &sig, msg, NULL, precomputed_nonce_function, nonce2));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, precomputed_nonce_function, nonce2) == 1);
        CHECK(secp256k1_ec_pubkey_create(CTX, &pubkey, key) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, NULL, msg, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, NULL, &pubkey));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, NULL));
        CHECK(secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ec_pubkey_create(CTX, &pubkey, NULL));
        /* That pubkeyload fails via an ARGCHECK is a little odd but makes sense because pubkeys are an opaque data type. */
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_verify(CTX, &sig, msg, &pubkey));
        siglen = 72;
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, NULL, &siglen, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, NULL, signature, siglen));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_der(CTX, &sig, NULL, siglen));
        CHECK(secp256k1_ecdsa_signature_parse_der(CTX, &sig, signature, siglen) == 1);
        siglen = 10;
        /* Too little room for a signature does not fail via ARGCHECK. */
        CHECK(secp256k1_ecdsa_signature_serialize_der(CTX, signature, &siglen, &sig) == 0);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_normalize(CTX, NULL, NULL));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, NULL, &sig));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_serialize_compact(CTX, signature, NULL));
        CHECK(secp256k1_ecdsa_signature_serialize_compact(CTX, signature, &sig) == 1);
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, NULL, signature));
        CHECK_ILLEGAL(CTX, secp256k1_ecdsa_signature_parse_compact(CTX, &sig, NULL));
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 1);
        memset(signature, 255, 64);
        CHECK(secp256k1_ecdsa_signature_parse_compact(CTX, &sig, signature) == 0);
    }

    /* Nonce function corner cases. */
    for (t = 0; t < 2; t++) {
        static const unsigned char zero[32] = {0x00};
        int i;
        unsigned char key[32];
        unsigned char msg[32];
        secp256k1_ecdsa_signature sig2;
        secp256k1_scalar sr[512], ss;
        const unsigned char *extra;
        extra = t == 0 ? NULL : zero;
        memset(msg, 0, 32);
        msg[31] = 1;
        /* High key results in signature failure. */
        memset(key, 0xFF, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Zero key results in signature failure. */
        memset(key, 0, 32);
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, NULL, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* Nonce function failure results in signature failure. */
        key[31] = 1;
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_fail, extra) == 0);
        CHECK(is_empty_signature(&sig));
        /* The retry loop successfully makes its way to the first good value. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig, msg, key, nonce_function_test_retry, extra) == 1);
        CHECK(!is_empty_signature(&sig));
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, nonce_function_rfc6979, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function is deterministic. */
        CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
        CHECK(!is_empty_signature(&sig2));
        CHECK(secp256k1_memcmp_var(&sig, &sig2, sizeof(sig)) == 0);
        /* The default nonce function changes output with different messages. */
        for(i = 0; i < 256; i++) {
            int j;
            msg[0] = i;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        msg[0] = 0;
        msg[31] = 2;
        /* The default nonce function changes output with different keys. */
        for(i = 256; i < 512; i++) {
            int j;
            key[0] = i - 256;
            CHECK(secp256k1_ecdsa_sign(CTX, &sig2, msg, key, NULL, extra) == 1);
            CHECK(!is_empty_signature(&sig2));
            secp256k1_ecdsa_signature_load(CTX, &sr[i], &ss, &sig2);
            for (j = 0; j < i; j++) {
                CHECK(!secp256k1_scalar_eq(&sr[i], &sr[j]));
            }
        }
        key[0] = 0;
    }

    {
        /* Check that optional nonce arguments do not have equivalent effect. */
        const unsigned char zeros[32] = {0};
        unsigned char nonce[32];
        unsigned char nonce2[32];
        unsigned char nonce3[32];
        unsigned char nonce4[32];
        SECP256K1_CHECKMEM_UNDEFINE(nonce,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce2,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce3,32);
        SECP256K1_CHECKMEM_UNDEFINE(nonce4,32);
        CHECK(nonce_function_rfc6979(nonce, zeros, zeros, NULL, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce,32);
        CHECK(nonce_function_rfc6979(nonce2, zeros, zeros, zeros, NULL, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce2,32);
        CHECK(nonce_function_rfc6979(nonce3, zeros, zeros, NULL, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce3,32);
        CHECK(nonce_function_rfc6979(nonce4, zeros, zeros, zeros, (void *)zeros, 0) == 1);
        SECP256K1_CHECKMEM_CHECK(nonce4,32);
        CHECK(secp256k1_memcmp_var(nonce, nonce2, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce3, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce2, nonce4, 32) != 0);
        CHECK(secp256k1_memcmp_var(nonce3, nonce4, 32) != 0);
    }


    /* Privkey export where pubkey is the point at infinity. */
    {
        unsigned char privkey[300];
        unsigned char seckey[32] = {
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
            0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xff, 0xfe,
            0xba, 0xae, 0xdc, 0xe6, 0xaf, 0x48, 0xa0, 0x3b,
            0xbf, 0xd2, 0x5e, 0x8c, 0xd0, 0x36, 0x41, 0x41,
        };
        size_t outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 0));
        outlen = 300;
        CHECK(!ec_privkey_export_der(CTX, privkey, &outlen, seckey, 1));
    }
}